

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc_io.c
# Opt level: O1

size_t duckdb_je_malloc_vsnprintf(char *str,size_t size,char *format,__va_list_tag *ap)

{
  char *pcVar1;
  byte bVar2;
  char cVar3;
  void *pvVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  long lVar8;
  char cVar9;
  uint uVar10;
  uintmax_t uVar11;
  int *piVar12;
  ulong uVar13;
  char *pcVar14;
  size_t sVar15;
  size_t sVar16;
  byte bVar17;
  undefined7 uVar20;
  undefined8 *puVar18;
  ulong *puVar19;
  char *format_00;
  byte *nptr;
  ulong uVar21;
  uint uVar22;
  uint *puVar23;
  uint uVar24;
  char *in_R8;
  char cVar25;
  long lVar26;
  ulong uVar27;
  int iVar28;
  ulong uVar29;
  long lVar30;
  __va_list_tag _Stack_190;
  undefined1 auStack_170 [24];
  ulong uStack_158;
  char *pcStack_150;
  char *pcStack_148;
  ulong uStack_c0;
  undefined1 auStack_b0 [4];
  uint local_ac;
  char *local_a8;
  char *f;
  char local_91;
  __va_list_tag *local_90;
  uint local_88;
  uint local_84;
  undefined8 local_80;
  char buf [66];
  
  uVar27 = 0;
  local_a8 = str;
  f = format;
  local_90 = ap;
LAB_001f9a5c:
  for (; cVar25 = *f, cVar25 != '%'; f = f + 1) {
    if (cVar25 == '\0') {
      uVar13 = size - 1;
      if (uVar27 < size) {
        uVar13 = uVar27;
      }
      local_a8[uVar13] = '\0';
      return uVar27;
    }
    if (uVar27 < size) {
      local_a8[uVar27] = cVar25;
    }
    uVar27 = uVar27 + 1;
  }
  local_84 = 0;
  local_88 = 0;
  local_ac = 0;
  bVar5 = false;
  nptr = (byte *)f;
LAB_001f9aa4:
  f = (char *)(nptr + 1);
  bVar6 = bVar5;
switchD_001f9ace_caseD_23:
  bVar5 = bVar6;
  nptr = (byte *)f;
  uVar10 = *nptr - 0x20;
  if (uVar10 < 0x1a) goto code_r0x001f9ac2;
  goto switchD_001f9ace_caseD_21;
code_r0x001f9ac2:
  f = (char *)(nptr + 1);
  bVar6 = true;
  switch((uint)*nptr) {
  case 0x20:
    goto switchD_001f9ace_caseD_20;
  default:
    goto switchD_001f9ace_caseD_21;
  case 0x23:
    goto switchD_001f9ace_caseD_23;
  case 0x2a:
    uVar10 = ap->gp_offset;
    if ((ulong)uVar10 < 0x29) {
      puVar23 = (uint *)((ulong)uVar10 + (long)ap->reg_save_area);
      ap->gp_offset = uVar10 + 8;
    }
    else {
      puVar23 = (uint *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar23 + 2;
    }
    uVar22 = *puVar23;
    uVar10 = -uVar22;
    if (0 < (int)uVar22) {
      uVar10 = uVar22;
    }
    local_ac = local_ac & 0xff;
    if ((int)uVar22 < 0) {
      local_ac = 1;
    }
    cVar25 = ' ';
    goto LAB_001f9b13;
  case 0x2b:
    local_84 = 1;
    goto LAB_001f9aa4;
  case 0x2d:
    local_ac = (uint)CONCAT71((int7)((ulong)((long)&switchD_001f9ace::switchdataD_01446ec8 +
                                            (long)(int)(&switchD_001f9ace::switchdataD_01446ec8)
                                                       [uVar10]) >> 8),1);
    goto LAB_001f9aa4;
  case 0x30:
    cVar25 = '0';
    break;
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    cVar25 = ' ';
  }
  uStack_c0 = 0x1f9afa;
  f = (char *)nptr;
  piVar12 = __errno_location();
  *piVar12 = 0;
  uStack_c0 = 0x1f9b0d;
  uVar11 = duckdb_je_malloc_strtoumax((char *)nptr,&f,10);
  uVar10 = (uint)uVar11;
  goto LAB_001f9b13;
switchD_001f9ace_caseD_20:
  local_88 = 1;
  goto LAB_001f9aa4;
switchD_001f9ace_caseD_21:
  cVar25 = ' ';
  uVar10 = 0xffffffff;
  f = (char *)nptr;
LAB_001f9b13:
  uStack_c0 = 0xffffffffffffffff;
  uVar13 = 0xffffffffffffffff;
  pcVar14 = f;
  pcVar1 = f;
  if (*f == '.') {
    pcVar1 = f + 1;
    if ((byte)f[1] - 0x30 < 10) {
      uStack_c0 = 0x1f9b41;
      f = pcVar1;
      piVar12 = __errno_location();
      *piVar12 = 0;
      uStack_c0 = 0x1f9b54;
      uVar13 = duckdb_je_malloc_strtoumax(pcVar1,&f,10);
      ap = local_90;
      pcVar1 = f;
    }
    else {
      uStack_c0 = 0xffffffffffffffff;
      uVar13 = uStack_c0;
      ap = local_90;
      if (f[1] == 0x2a) {
        uVar22 = local_90->gp_offset;
        if ((ulong)uVar22 < 0x29) {
          puVar23 = (uint *)((ulong)uVar22 + (long)local_90->reg_save_area);
          local_90->gp_offset = uVar22 + 8;
        }
        else {
          puVar23 = (uint *)local_90->overflow_arg_area;
          local_90->overflow_arg_area = puVar23 + 2;
        }
        uVar13 = (ulong)*puVar23;
        pcVar14 = f + 2;
        pcVar1 = pcVar14;
      }
    }
  }
  f = pcVar1;
  uVar22 = local_ac;
  uStack_158 = CONCAT71((int7)((ulong)pcVar14 >> 8),0x3f);
  uVar24 = (byte)*f - 0x6a;
  pcVar1 = f;
  if (uVar24 < 0x11) {
    in_R8 = (char *)0x10481;
    if ((0x10481U >> (uVar24 & 0x1f) & 1) == 0) {
      if (uVar24 == 2) {
        uVar20 = (undefined7)((ulong)(f + 1) >> 8);
        uStack_158 = CONCAT71(uVar20,0x6c);
        pcVar1 = f + 1;
        if (f[1] == 'l') {
          uStack_158 = CONCAT71(uVar20,0x71);
          pcVar1 = f + 2;
        }
      }
    }
    else {
      uStack_158 = (ulong)(byte)*f;
      pcVar1 = f + 1;
    }
  }
  f = pcVar1;
  pcVar1 = f;
  bVar2 = *f;
  pcVar14 = (char *)(ulong)(bVar2 - 0x6f);
  uVar21 = (ulong)(int)uVar10;
  bVar17 = (byte)uStack_158;
  if (9 < bVar2 - 0x6f) {
    if (bVar2 != 0x69) {
      if (bVar2 == 0x58) goto switchD_001f9bac_caseD_9;
      if (bVar2 == 99) {
        uVar22 = ap->gp_offset;
        if ((ulong)uVar22 < 0x29) {
          pcVar14 = (char *)((ulong)uVar22 + (long)ap->reg_save_area);
          ap->gp_offset = uVar22 + 8;
        }
        else {
          pcVar14 = (char *)ap->overflow_arg_area;
          ap->overflow_arg_area = pcVar14 + 8;
        }
        cVar3 = *pcVar14;
        lVar26 = uVar21 - 1;
        if (uVar10 < 2) {
          lVar26 = 0;
        }
        if (uVar10 == 0xffffffff) {
          lVar26 = 0;
        }
        lVar30 = lVar26;
        if ((local_ac & 1) == 0) {
          for (; lVar30 != 0; lVar30 = lVar30 + -1) {
            if (uVar27 < size) {
              local_a8[uVar27] = cVar25;
            }
            uVar27 = uVar27 + 1;
          }
        }
        if (uVar27 < size) {
          local_a8[uVar27] = cVar3;
        }
        uVar27 = uVar27 + 1;
        if ((local_ac & 1) != 0) {
          for (; lVar26 != 0; lVar26 = lVar26 + -1) {
            if (uVar27 < size) {
              local_a8[uVar27] = ' ';
            }
            uVar27 = uVar27 + 1;
          }
        }
        goto LAB_001fa518;
      }
      if (bVar2 != 100) {
        if (uVar27 < size) {
          local_a8[uVar27] = bVar2;
        }
        uVar27 = uVar27 + 1;
        f = f + 1;
        goto LAB_001f9a5c;
      }
    }
    uVar24 = ap->gp_offset;
    uVar13 = (ulong)uVar24;
    uVar7 = (uint)uStack_158 & 0xff;
    format_00 = (char *)(ulong)(uVar7 - 0x6a);
    local_80 = f;
    local_91 = cVar25;
    if (uVar7 - 0x6a < 0xb) {
      puVar23 = &switchD_001f9e1e::switchdataD_01446f58;
      uStack_158 = (long)&switchD_001f9e1e::switchdataD_01446f58 +
                   (long)(int)(&switchD_001f9e1e::switchdataD_01446f58)[(long)format_00];
      switch(format_00) {
      case (char *)0x0:
      case (char *)0x2:
      case (char *)0x6:
      case (char *)0x7:
      case (char *)0xa:
        goto switchD_001f9e1e_caseD_0;
      default:
duckdb_je_malloc_snprintf:
        _Stack_190.reg_save_area = auStack_170;
        pcStack_148 = f;
        _Stack_190.overflow_arg_area = auStack_b0;
        _Stack_190.gp_offset = 0x18;
        _Stack_190.fp_offset = 0x30;
        pcStack_150 = in_R8;
        sVar16 = duckdb_je_malloc_vsnprintf(pcVar14,(size_t)puVar23,format_00,&_Stack_190);
        return sVar16;
      }
    }
    if ((uVar7 != 0xfa) && (uVar7 != 0x7a)) {
      if (uVar7 == 0xbf) {
        if (uVar24 < 0x29) {
          puVar23 = (uint *)(uVar13 + (long)ap->reg_save_area);
          ap->gp_offset = uVar24 + 8;
        }
        else {
          puVar23 = (uint *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar23 + 2;
        }
        uVar13 = (ulong)*puVar23;
        goto LAB_001f9e43;
      }
      if (((uVar7 != 0xea) && (uVar7 != 0xec)) && (uVar7 != 0xf1)) {
        if (uVar24 < 0x29) {
          piVar12 = (int *)(uVar13 + (long)ap->reg_save_area);
          ap->gp_offset = uVar24 + 8;
        }
        else {
          piVar12 = (int *)ap->overflow_arg_area;
          ap->overflow_arg_area = piVar12 + 2;
        }
        uVar13 = (ulong)*piVar12;
        goto LAB_001f9e43;
      }
    }
switchD_001f9e1e_caseD_0:
    if (uVar24 < 0x29) {
      puVar19 = (ulong *)(uVar13 + (long)ap->reg_save_area);
      ap->gp_offset = uVar24 + 8;
    }
    else {
      puVar19 = (ulong *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar19 + 1;
    }
    uVar13 = *puVar19;
LAB_001f9e43:
    cVar3 = '-';
    cVar9 = cVar3;
    if ((local_88 & 1) != 0) {
      cVar9 = ' ';
    }
    uVar29 = -uVar13;
    if (0 < (long)uVar13) {
      uVar29 = uVar13;
    }
    buf[0x40] = '\0';
    iVar28 = 0;
    do {
      in_R8 = (char *)(ulong)(iVar28 + 0x3f);
      buf[(long)in_R8] = "0123456789"[uVar29 % 10];
      iVar28 = iVar28 + -1;
      bVar5 = 9 < uVar29;
      uVar29 = uVar29 / 10;
    } while (bVar5);
    if ((local_84 & 1) != 0) {
      cVar9 = '+';
    }
    pcVar1 = buf;
    uVar29 = (ulong)(uint)-iVar28;
    if (((long)uVar13 < 0) || (cVar3 = cVar9, cVar9 != '-')) {
      uVar29 = uVar29 + 1;
      buf[(long)(in_R8 + -1)] = cVar3;
      pcVar1 = (char *)((long)&local_80 + 7);
    }
    lVar26 = uVar21 - uVar29;
    if (uVar21 < uVar29) {
      lVar26 = 0;
    }
    if (uVar10 == 0xffffffff) {
      lVar26 = 0;
    }
    lVar30 = lVar26;
    if ((local_ac & 1) == 0) {
      for (; lVar30 != 0; lVar30 = lVar30 + -1) {
        if (uVar27 < size) {
          local_a8[uVar27] = cVar25;
        }
        uVar27 = uVar27 + 1;
      }
    }
    uVar13 = size - uVar27;
    if (uVar27 <= size && uVar13 != 0) {
      if (uVar29 < uVar13) {
        uVar13 = uVar29;
      }
      uStack_c0 = 0x1f9f25;
      switchD_00b1522a::default(local_a8 + uVar27,pcVar1 + (long)in_R8,uVar13);
    }
    uVar27 = uVar27 + uVar29;
    if ((uVar22 & 1) != 0) {
      for (; lVar26 != 0; lVar26 = lVar26 + -1) {
        if (uVar27 < size) {
          local_a8[uVar27] = ' ';
        }
        uVar27 = uVar27 + 1;
      }
    }
    f = local_80 + 1;
    ap = local_90;
    goto LAB_001f9a5c;
  }
  puVar23 = &switchD_001f9bac::switchdataD_01446f30;
  format_00 = (char *)((long)&switchD_001f9bac::switchdataD_01446f30 +
                      (long)(int)(&switchD_001f9bac::switchdataD_01446f30)[(long)pcVar14]);
  switch(pcVar14) {
  case (char *)0x0:
    bVar17 = bVar17 | 0x80;
    uVar22 = ap->gp_offset;
    uVar13 = (ulong)uVar22;
    if (bVar17 == 0xfa) {
      if (uVar22 < 0x29) {
        pvVar4 = ap->reg_save_area;
LAB_001fa403:
        puVar19 = (ulong *)((long)pvVar4 + uVar13);
        ap->gp_offset = uVar22 + 8;
      }
      else {
LAB_001fa40b:
        puVar19 = (ulong *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar19 + 1;
      }
LAB_001fa417:
      uVar13 = *puVar19;
    }
    else {
      if (bVar17 == 0xea) {
LAB_001f9be0:
        if (0x28 < uVar22) goto LAB_001fa40b;
        puVar19 = (ulong *)((long)ap->reg_save_area + uVar13);
        ap->gp_offset = uVar22 + 8;
        goto LAB_001fa417;
      }
      if (bVar17 == 0xec) {
        if (uVar22 < 0x29) {
          pvVar4 = ap->reg_save_area;
          goto LAB_001fa403;
        }
        goto LAB_001fa40b;
      }
      if (bVar17 == 0xf1) goto LAB_001f9be0;
      if (uVar22 < 0x29) {
        puVar23 = (uint *)(uVar13 + (long)ap->reg_save_area);
        ap->gp_offset = uVar22 + 8;
      }
      else {
        puVar23 = (uint *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar23 + 2;
      }
      uVar13 = (ulong)*puVar23;
    }
    in_R8 = "0123456789abcdefghijklmnopqrstuvwxyz";
    buf[0x40] = '\0';
    lVar26 = 0;
    do {
      uVar29 = (ulong)((int)lVar26 + 0x3f);
      cVar3 = "0123456789abcdefghijklmnopqrstuvwxyz"[(uint)uVar13 & 7];
      buf[uVar29] = cVar3;
      lVar26 = lVar26 + -1;
      bVar6 = 7 < uVar13;
      uVar13 = uVar13 >> 3;
    } while (bVar6);
    pcVar14 = buf + uVar29;
    uVar13 = -lVar26;
    if ((bVar5) && (cVar3 != '0')) {
      uVar13 = 1 - lVar26;
      buf[uVar29 - 1] = '0';
      pcVar14 = buf + (uVar29 - 1);
    }
    lVar26 = uVar21 - uVar13;
    if (uVar21 < uVar13) {
      lVar26 = 0;
    }
    if (uVar10 == 0xffffffff) {
      lVar26 = 0;
    }
    lVar30 = lVar26;
    if ((local_ac & 1) == 0) {
      for (; lVar30 != 0; lVar30 = lVar30 + -1) {
        if (uVar27 < size) {
          local_a8[uVar27] = cVar25;
        }
        uVar27 = uVar27 + 1;
      }
    }
    uVar21 = size - uVar27;
    if (uVar27 <= size && uVar21 != 0) {
      if (uVar13 < uVar21) {
        uVar21 = uVar13;
      }
      uStack_c0 = 0x1fa4d3;
      switchD_00b1522a::default(local_a8 + uVar27,pcVar14,uVar21);
    }
    uVar27 = uVar27 + uVar13;
    ap = local_90;
    if ((local_ac & 1) != 0) {
      for (; lVar26 != 0; lVar26 = lVar26 + -1) {
        if (uVar27 < size) {
          local_a8[uVar27] = ' ';
        }
        uVar27 = uVar27 + 1;
      }
    }
    break;
  case (char *)0x1:
    uVar22 = ap->gp_offset;
    if ((ulong)uVar22 < 0x29) {
      puVar19 = (ulong *)((ulong)uVar22 + (long)ap->reg_save_area);
      ap->gp_offset = uVar22 + 8;
    }
    else {
      puVar19 = (ulong *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar19 + 1;
    }
    buf[0x40] = '\0';
    lVar26 = -2;
    uVar13 = *puVar19;
    do {
      uVar29 = (ulong)((int)lVar26 + 0x41);
      buf[uVar29] = "0123456789abcdef"[(uint)uVar13 & 0xf];
      lVar26 = lVar26 + -1;
      bVar5 = 0xf < uVar13;
      uVar13 = uVar13 >> 4;
    } while (bVar5);
    uVar13 = -lVar26;
    (buf + (uVar29 - 2))[0] = '0';
    (buf + (uVar29 - 2))[1] = 'x';
    lVar30 = uVar21 + lVar26;
    if (uVar21 < uVar13) {
      lVar30 = 0;
    }
    if (uVar10 == 0xffffffff) {
      lVar30 = 0;
    }
    lVar8 = lVar30;
    if ((local_ac & 1) == 0) {
      for (; lVar8 != 0; lVar8 = lVar8 + -1) {
        if (uVar27 < size) {
          local_a8[uVar27] = cVar25;
        }
        uVar27 = uVar27 + 1;
      }
    }
    uVar21 = size - uVar27;
    if (uVar27 <= size && uVar21 != 0) {
      if (uVar13 < uVar21) {
        uVar21 = uVar13;
      }
      uStack_c0 = 0x1fa112;
      switchD_00b1522a::default(local_a8 + uVar27,buf + (uVar29 - 2),uVar21);
    }
    uVar27 = uVar27 - lVar26;
    ap = local_90;
    if ((local_ac & 1) != 0) {
      for (; lVar30 != 0; lVar30 = lVar30 + -1) {
        if (uVar27 < size) {
          local_a8[uVar27] = ' ';
        }
        uVar27 = uVar27 + 1;
      }
    }
    break;
  default:
    goto duckdb_je_malloc_snprintf;
  case (char *)0x4:
    uVar22 = ap->gp_offset;
    if ((ulong)uVar22 < 0x29) {
      puVar18 = (undefined8 *)((ulong)uVar22 + (long)ap->reg_save_area);
      ap->gp_offset = uVar22 + 8;
    }
    else {
      puVar18 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar18 + 1;
    }
    pcVar14 = (char *)*puVar18;
    if ((int)uVar13 < 0) {
      uStack_c0 = 0x1fa320;
      sVar15 = strlen(pcVar14);
    }
    else {
      sVar15 = uVar13 & 0xffffffff;
    }
    lVar26 = uVar21 - sVar15;
    if (uVar21 < sVar15) {
      lVar26 = 0;
    }
    if (uVar10 == 0xffffffff) {
      lVar26 = 0;
    }
    lVar30 = lVar26;
    if ((local_ac & 1) == 0) {
      for (; lVar30 != 0; lVar30 = lVar30 + -1) {
        if (uVar27 < size) {
          local_a8[uVar27] = cVar25;
        }
        uVar27 = uVar27 + 1;
      }
    }
    uVar13 = size - uVar27;
    if (uVar27 <= size && uVar13 != 0) {
      if (sVar15 < uVar13) {
        uVar13 = sVar15;
      }
      uStack_c0 = 0x1fa389;
      switchD_00b1522a::default(local_a8 + uVar27,pcVar14,uVar13);
    }
    uVar27 = uVar27 + sVar15;
    ap = local_90;
    if ((local_ac & 1) != 0) {
      for (; lVar26 != 0; lVar26 = lVar26 + -1) {
        if (uVar27 < size) {
          local_a8[uVar27] = ' ';
        }
        uVar27 = uVar27 + 1;
      }
    }
    break;
  case (char *)0x6:
    bVar17 = bVar17 | 0x80;
    uVar22 = ap->gp_offset;
    uVar13 = (ulong)uVar22;
    if (bVar17 == 0xfa) {
      if (0x28 < uVar22) goto LAB_001fa547;
      pvVar4 = ap->reg_save_area;
LAB_001fa53f:
      puVar19 = (ulong *)((long)pvVar4 + uVar13);
      ap->gp_offset = uVar22 + 8;
    }
    else {
      if (bVar17 != 0xea) {
        if (bVar17 == 0xec) {
          if (uVar22 < 0x29) {
            pvVar4 = ap->reg_save_area;
            goto LAB_001fa53f;
          }
          goto LAB_001fa547;
        }
        if (bVar17 != 0xf1) {
          if (uVar22 < 0x29) {
            puVar23 = (uint *)(uVar13 + (long)ap->reg_save_area);
            ap->gp_offset = uVar22 + 8;
          }
          else {
            puVar23 = (uint *)ap->overflow_arg_area;
            ap->overflow_arg_area = puVar23 + 2;
          }
          uVar13 = (ulong)*puVar23;
          goto LAB_001fa556;
        }
      }
      if (uVar22 < 0x29) {
        puVar19 = (ulong *)((long)ap->reg_save_area + uVar13);
        ap->gp_offset = uVar22 + 8;
      }
      else {
LAB_001fa547:
        puVar19 = (ulong *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar19 + 1;
      }
    }
    uVar13 = *puVar19;
LAB_001fa556:
    in_R8 = (char *)0xa;
    buf[0x40] = '\0';
    iVar28 = 0;
    do {
      uVar22 = iVar28 + 0x3f;
      buf[uVar22] = "0123456789"[uVar13 % 10];
      iVar28 = iVar28 + -1;
      bVar5 = 9 < uVar13;
      uVar13 = uVar13 / 10;
    } while (bVar5);
    uVar13 = (ulong)(uint)-iVar28;
    lVar26 = uVar21 - uVar13;
    if (uVar21 < uVar13) {
      lVar26 = 0;
    }
    if (uVar10 == 0xffffffff) {
      lVar26 = 0;
    }
    lVar30 = lVar26;
    if ((local_ac & 1) == 0) {
      for (; lVar30 != 0; lVar30 = lVar30 + -1) {
        if (uVar27 < size) {
          local_a8[uVar27] = cVar25;
        }
        uVar27 = uVar27 + 1;
      }
    }
    uVar21 = size - uVar27;
    if (uVar27 <= size && uVar21 != 0) {
      if (uVar13 < uVar21) {
        uVar21 = uVar13;
      }
      uStack_c0 = 0x1fa5f2;
      switchD_00b1522a::default(local_a8 + uVar27,buf + uVar22,uVar21);
    }
    uVar27 = uVar27 + uVar13;
    if ((local_ac & 1) != 0) {
      for (; lVar26 != 0; lVar26 = lVar26 + -1) {
        if (uVar27 < size) {
          local_a8[uVar27] = ' ';
        }
        uVar27 = uVar27 + 1;
      }
    }
    f = pcVar1 + 1;
    ap = local_90;
    goto LAB_001f9a5c;
  case (char *)0x9:
switchD_001f9bac_caseD_9:
    bVar17 = bVar17 | 0x80;
    uVar22 = ap->gp_offset;
    uVar13 = (ulong)uVar22;
    if (bVar17 == 0xfa) {
      if (uVar22 < 0x29) {
        pvVar4 = ap->reg_save_area;
LAB_001fa1bf:
        puVar19 = (ulong *)((long)pvVar4 + uVar13);
        ap->gp_offset = uVar22 + 8;
      }
      else {
LAB_001fa1c7:
        puVar19 = (ulong *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar19 + 1;
      }
LAB_001fa1d3:
      uVar13 = *puVar19;
    }
    else {
      if (bVar17 == 0xea) {
LAB_001f9cf7:
        if (0x28 < uVar22) goto LAB_001fa1c7;
        puVar19 = (ulong *)((long)ap->reg_save_area + uVar13);
        ap->gp_offset = uVar22 + 8;
        goto LAB_001fa1d3;
      }
      if (bVar17 == 0xec) {
        if (uVar22 < 0x29) {
          pvVar4 = ap->reg_save_area;
          goto LAB_001fa1bf;
        }
        goto LAB_001fa1c7;
      }
      if (bVar17 == 0xf1) goto LAB_001f9cf7;
      if (uVar22 < 0x29) {
        puVar23 = (uint *)(uVar13 + (long)ap->reg_save_area);
        ap->gp_offset = uVar22 + 8;
      }
      else {
        puVar23 = (uint *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar23 + 2;
      }
      uVar13 = (ulong)*puVar23;
    }
    cVar3 = *f;
    buf[0x40] = '\0';
    pcVar14 = "0123456789abcdef";
    if (cVar3 == 'X') {
      pcVar14 = "0123456789ABCDEF";
    }
    lVar26 = 0;
    do {
      uVar29 = (ulong)((int)lVar26 + 0x3f);
      in_R8 = (char *)(ulong)(byte)pcVar14[(uint)uVar13 & 0xf];
      buf[uVar29] = pcVar14[(uint)uVar13 & 0xf];
      lVar26 = lVar26 + -1;
      bVar6 = 0xf < uVar13;
      uVar13 = uVar13 >> 4;
    } while (bVar6);
    pcVar14 = buf;
    if (bVar5) {
      buf[uVar29 - 2] = '0';
      buf[uVar29 - 1] = (cVar3 != 'X') << 5 | 0x58;
      pcVar14 = (char *)((long)&local_80 + 6);
      uVar13 = 2 - lVar26;
    }
    else {
      uVar13 = -lVar26;
    }
    lVar26 = uVar21 - uVar13;
    if (uVar21 < uVar13) {
      lVar26 = 0;
    }
    if (uVar10 == 0xffffffff) {
      lVar26 = 0;
    }
    lVar30 = lVar26;
    if ((local_ac & 1) == 0) {
      for (; lVar30 != 0; lVar30 = lVar30 + -1) {
        if (uVar27 < size) {
          local_a8[uVar27] = cVar25;
        }
        uVar27 = uVar27 + 1;
      }
    }
    uVar21 = size - uVar27;
    if (uVar27 <= size && uVar21 != 0) {
      if (uVar13 < uVar21) {
        uVar21 = uVar13;
      }
      uStack_c0 = 0x1fa2b0;
      switchD_00b1522a::default(local_a8 + uVar27,pcVar14 + uVar29,uVar21);
    }
    uVar27 = uVar27 + uVar13;
    ap = local_90;
    if ((local_ac & 1) != 0) {
      for (; lVar26 != 0; lVar26 = lVar26 + -1) {
        if (uVar27 < size) {
          local_a8[uVar27] = ' ';
        }
        uVar27 = uVar27 + 1;
      }
    }
  }
LAB_001fa518:
  f = pcVar1 + 1;
  goto LAB_001f9a5c;
}

Assistant:

JEMALLOC_COLD
size_t
malloc_vsnprintf(char *str, size_t size, const char *format, va_list ap) {
	size_t i;
	const char *f;

#define APPEND_C(c) do {						\
	if (i < size) {							\
		str[i] = (c);						\
	}								\
	i++;								\
} while (0)
#define APPEND_S(s, slen) do {						\
	if (i < size) {							\
		size_t cpylen = (slen <= size - i) ? slen : size - i;	\
		memcpy(&str[i], s, cpylen);				\
	}								\
	i += slen;							\
} while (0)
#define APPEND_PADDED_S(s, slen, width, left_justify) do {		\
	/* Left padding. */						\
	size_t pad_len = (width == -1) ? 0 : ((slen < (size_t)width) ?	\
	    (size_t)width - slen : 0);					\
	if (!left_justify && pad_len != 0) {				\
		size_t j;						\
		for (j = 0; j < pad_len; j++) {				\
			if (pad_zero) {					\
				APPEND_C('0');				\
			} else {					\
				APPEND_C(' ');				\
			}						\
		}							\
	}								\
	/* Value. */							\
	APPEND_S(s, slen);						\
	/* Right padding. */						\
	if (left_justify && pad_len != 0) {				\
		size_t j;						\
		for (j = 0; j < pad_len; j++) {				\
			APPEND_C(' ');					\
		}							\
	}								\
}